

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_query_square_flag(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t flag;
  char c;
  
  flag = L'\0';
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&flag);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Query [grasvwdftniolx]: ",&c);
    if (!_Var1) {
      return;
    }
    switch(c) {
    case 'a':
      flag = L'\x03';
      break;
    default:
      break;
    case 'd':
      flag = L'\x13';
      break;
    case 'f':
      flag = L'\b';
      break;
    case 'g':
      flag = L'\x02';
      break;
    case 'i':
      flag = L'\v';
      break;
    case 'l':
      flag = L'\r';
      break;
    case 'n':
      flag = L'\n';
      break;
    case 'o':
      flag = L'\f';
      break;
    case 'r':
      flag = L'\x04';
      break;
    case 's':
      flag = L'\x05';
      break;
    case 't':
      flag = L'\t';
      break;
    case 'v':
      flag = L'\x06';
      break;
    case 'w':
      flag = L'\a';
      break;
    case 'x':
      flag = L'\x0e';
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",flag);
  }
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_square_flag,&flag);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_square_flag(struct command *cmd)
{
	int flag = 0;

	if (cmd_get_arg_choice(cmd, "choice", &flag) != CMD_OK) {
		char c;

		if (!get_com("Debug Command Query [grasvwdftniolx]: ", &c))
			return;
		switch (c) {
			case 'g': flag = SQUARE_GLOW; break;
			case 'r': flag = SQUARE_ROOM; break;
			case 'a': flag = SQUARE_VAULT; break;
			case 's': flag = SQUARE_SEEN; break;
			case 'v': flag = SQUARE_VIEW; break;
			case 'w': flag = SQUARE_WASSEEN; break;
			case 'd': flag = SQUARE_DTRAP; break;
			case 'f': flag = SQUARE_FEEL; break;
			case 't': flag = SQUARE_TRAP; break;
			case 'n': flag = SQUARE_INVIS; break;
			case 'i': flag = SQUARE_WALL_INNER; break;
			case 'o': flag = SQUARE_WALL_OUTER; break;
			case 'l': flag = SQUARE_WALL_SOLID; break;
			case 'x': flag = SQUARE_MON_RESTRICT; break;
		}
		cmd_set_arg_choice(cmd, "choice", flag);
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_square_flag, &flag);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}